

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_ocaml_struct_reader
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  ostream *poVar2;
  t_ocaml_generator *this_00;
  pointer pptVar3;
  string t;
  string id;
  string str;
  string sname;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  type_name_abi_cxx11_(&local_f0,this,&tstruct->super_t_type);
  std::__cxx11::string::string((string *)&local_90,"_str",(allocator *)&local_170);
  t_generator::tmp(&local_110,(t_generator *)this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"_t",(allocator *)&local_130);
  t_generator::tmp(&local_170,(t_generator *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"_id",(allocator *)&local_150);
  t_generator::tmp(&local_130,(t_generator *)this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"let rec read_");
  poVar2 = std::operator<<(poVar2,(string *)&local_f0);
  poVar2 = std::operator<<(poVar2," (iprot : Protocol.t) =");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"let ");
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2," = new ");
  poVar2 = std::operator<<(poVar2,(string *)&local_f0);
  poVar2 = std::operator<<(poVar2," in");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"ignore(iprot#readStructBegin);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"(try while true do");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 2;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"let (_,");
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2,") = iprot#readFieldBegin in");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"if ");
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2," = Protocol.T_STOP then");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"raise Break");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"else ();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"(match ");
  poVar2 = std::operator<<(poVar2,(string *)&local_130);
  poVar2 = std::operator<<(poVar2," with ");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"| ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*pptVar3)->key_);
    std::operator<<(poVar2," -> (");
    poVar2 = std::operator<<(out,"if ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    this_00 = (t_ocaml_generator *)0x2d99ba;
    poVar2 = std::operator<<(poVar2," = ");
    type_to_enum_abi_cxx11_(&local_150,this_00,(*pptVar3)->type_);
    poVar2 = std::operator<<(poVar2,(string *)&local_150);
    poVar2 = std::operator<<(poVar2," then");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 2;
    tfield = *pptVar3;
    std::__cxx11::string::string((string *)&local_50,(string *)&local_110);
    generate_deserialize_field(this,out,tfield,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_150);
    poVar2 = std::operator<<(poVar2,"else");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,"  iprot#skip ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,")");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_150);
  poVar2 = std::operator<<(poVar2,"| _ -> ");
  poVar2 = std::operator<<(poVar2,"iprot#skip ");
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"iprot#readFieldEnd;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"done; ()");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"with Break -> ());");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"iprot#readStructEnd;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -2;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  string sname = type_name(tstruct);
  string str = tmp("_str");
  string t = tmp("_t");
  string id = tmp("_id");
  indent(out) << "let rec read_" << sname << " (iprot : Protocol.t) =" << endl;
  indent_up();
  indent(out) << "let " << str << " = new " << sname << " in" << endl;
  indent_up();
  indent(out) << "ignore(iprot#readStructBegin);" << endl;

  // Loop over reading in fields
  indent(out) << "(try while true do" << endl;
  indent_up();
  indent_up();

  // Read beginning field marker
  indent(out) << "let (_," << t << "," << id << ") = iprot#readFieldBegin in" << endl;

  // Check for field STOP marker and break
  indent(out) << "if " << t << " = Protocol.T_STOP then" << endl;
  indent_up();
  indent(out) << "raise Break" << endl;
  indent_down();
  indent(out) << "else ();" << endl;

  indent(out) << "(match " << id << " with " << endl;
  indent_up();
  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "| " << (*f_iter)->get_key() << " -> (";
    out << "if " << t << " = " << type_to_enum((*f_iter)->get_type()) << " then" << endl;
    indent_up();
    indent_up();
    generate_deserialize_field(out, *f_iter, str);
    indent_down();
    out << indent() << "else" << endl << indent() << "  iprot#skip " << t << ")" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "| _ -> "
      << "iprot#skip " << t << ");" << endl;
  indent_down();
  // Read field end marker
  indent(out) << "iprot#readFieldEnd;" << endl;
  indent_down();
  indent(out) << "done; ()" << endl;
  indent_down();
  indent(out) << "with Break -> ());" << endl;

  indent(out) << "iprot#readStructEnd;" << endl;

  indent(out) << str << endl << endl;
  indent_down();
  indent_down();
}